

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::Configure(cmake *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  mapped_type mVar1;
  cmState *pcVar2;
  cmMessenger *pcVar3;
  bool bVar4;
  bool b;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  cmValue cVar9;
  cmValue cVar10;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  cmValue value;
  optional<cmMakefileProfilingData::RAII> profilingRAII;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"project",&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"configure",&local_59);
  CreateProfilingEntry((cmake *)&profilingRAII,(string *)this,&local_80);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"deprecated",(allocator<char> *)&value);
  this_00 = &this->DiagLevels;
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar7 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"deprecated",(allocator<char> *)&value);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](this_00,&local_80);
    mVar1 = *pmVar8;
    std::__cxx11::string::~string((string *)&local_80);
    if (mVar1 == DIAG_ERROR) {
      bVar5 = true;
      SetSuppressDeprecatedWarnings(this,false);
    }
    else {
      if (mVar1 == DIAG_WARN) {
        bVar5 = false;
      }
      else {
        if (mVar1 != DIAG_IGNORE) goto LAB_002fad4b;
        bVar5 = true;
      }
      SetSuppressDeprecatedWarnings(this,bVar5);
      bVar5 = false;
    }
    SetDeprecatedWarningsAsErrors(this,bVar5);
  }
LAB_002fad4b:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"dev",(allocator<char> *)&value);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar7 != 1) goto LAB_002faeb6;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_WARN_DEPRECATED",(allocator<char> *)&value);
  cVar9 = cmState::GetCacheEntryValue(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_ERROR_DEPRECATED",(allocator<char> *)&value);
  cVar10 = cmState::GetCacheEntryValue(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar5 = cVar9.Value != (string *)0x0;
  bVar4 = cVar10.Value != (string *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"dev",(allocator<char> *)&value);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
           ::operator[](this_00,&local_80);
  mVar1 = *pmVar8;
  std::__cxx11::string::~string((string *)&local_80);
  if (mVar1 == DIAG_ERROR) {
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,true);
    if (bVar5 || bVar4) goto LAB_002faeb6;
    bVar5 = true;
    SetSuppressDeprecatedWarnings(this,false);
  }
  else {
    if (mVar1 == DIAG_WARN) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,false);
      if (bVar5 || bVar4) goto LAB_002faeb6;
      b = false;
    }
    else {
      if (mVar1 != DIAG_IGNORE) goto LAB_002faeb6;
      SetSuppressDevWarnings(this,true);
      SetDevWarningsAsErrors(this,false);
      b = true;
      if (bVar5 || bVar4) goto LAB_002faeb6;
    }
    SetSuppressDeprecatedWarnings(this,b);
    bVar5 = false;
  }
  SetDeprecatedWarningsAsErrors(this,bVar5);
LAB_002faeb6:
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_WARN_DEPRECATED",&local_81);
  value = cmState::GetCacheEntryValue(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (value.Value == (string *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = cmValue::IsOff(&value);
  }
  pcVar3->SuppressDeprecatedWarnings = bVar5;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_ERROR_DEPRECATED",&local_81);
  value = cmState::GetCacheEntryValue(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  bVar5 = cmValue::IsOn(&value);
  pcVar3->DeprecatedWarningsAsErrors = bVar5;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_81);
  value = cmState::GetCacheEntryValue(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  bVar5 = cmValue::IsOn(&value);
  pcVar3->SuppressDevWarnings = bVar5;
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_81);
  value = cmState::GetCacheEntryValue(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (value.Value == (string *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = cmValue::IsOff(&value);
  }
  pcVar3->DevWarningsAsErrors = bVar5;
  iVar6 = ActualConfigure(this);
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_81);
  cVar9 = cmState::GetGlobalProperty(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
    iVar6 = HandleDeleteCacheVariables(this,cVar9.Value);
  }
  std::_Optional_payload_base<cmMakefileProfilingData::RAII>::_M_reset
            ((_Optional_payload_base<cmMakefileProfilingData::RAII> *)&profilingRAII);
  return iVar6;
}

Assistant:

int cmake::Configure()
{
#if !defined(CMAKE_BOOTSTRAP)
  auto profilingRAII = this->CreateProfilingEntry("project", "configure");
#endif

  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    cmValue cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    cmValue cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  // Cache variables may have already been set by a previous invocation,
  // so we cannot rely on command line options alone. Always ensure our
  // messenger is in sync with the cache.
  cmValue value = this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());

  value = this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");
  this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  this->Messenger->SetSuppressDevWarnings(value.IsOn());

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());

  int ret = this->ActualConfigure();
  cmValue delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && !delCacheVars->empty()) {
    return this->HandleDeleteCacheVariables(*delCacheVars);
  }
  return ret;
}